

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

uint32_t __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::FindIndex
          (NodeSet *this,int32_t v)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  int *piVar4;
  uint32_t local_3c;
  int32_t e;
  uint uStack_24;
  bool seen_deleted_element;
  uint32_t deleted_index;
  uint32_t i;
  uint32_t mask;
  int32_t v_local;
  NodeSet *this_local;
  
  uVar3 = Vec<int>::size(&this->table_);
  uStack_24 = Hash(v);
  e = 0;
  bVar2 = false;
  while( true ) {
    uStack_24 = uStack_24 & uVar3 - 1;
    piVar4 = Vec<int>::operator[](&this->table_,uStack_24);
    iVar1 = *piVar4;
    if (v == iVar1) {
      return uStack_24;
    }
    if (iVar1 == -1) break;
    if ((iVar1 == -2) && (!bVar2)) {
      e = uStack_24;
      bVar2 = true;
    }
    uStack_24 = uStack_24 + 1;
  }
  if (bVar2) {
    local_3c = e;
  }
  else {
    local_3c = uStack_24;
  }
  return local_3c;
}

Assistant:

uint32_t FindIndex(int32_t v) const {
    // Search starting at hash index.
    const uint32_t mask = table_.size() - 1;
    uint32_t i = Hash(v) & mask;
    uint32_t deleted_index = 0;  // index of first deleted element we see
    bool seen_deleted_element = false;
    while (true) {
      int32_t e = table_[i];
      if (v == e) {
        return i;
      } else if (e == kEmpty) {
        // Return any previously encountered deleted slot.
        return seen_deleted_element ? deleted_index : i;
      } else if (e == kDel && !seen_deleted_element) {
        // Keep searching since v might be present later.
        deleted_index = i;
        seen_deleted_element = true;
      }
      i = (i + 1) & mask;  // Linear probing; quadratic is slightly slower.
    }
  }